

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitagg.cpp
# Opt level: O0

void duckdb::BitwiseOperation::Combine<duckdb::BitState<unsigned_short>,duckdb::BitXorOperation>
               (BitState<unsigned_short> *source,BitState<unsigned_short> *target,
               AggregateInputData *param_3)

{
  BitState<unsigned_short> *in_RSI;
  byte *in_RDI;
  
  if ((*in_RDI & 1) != 0) {
    if ((in_RSI->is_set & 1U) == 0) {
      Assign<unsigned_short,duckdb::BitState<unsigned_short>>
                (in_RSI,*(unsigned_short *)(in_RDI + 2));
      in_RSI->is_set = true;
    }
    else {
      BitXorOperation::Execute<unsigned_short,duckdb::BitState<unsigned_short>>
                (in_RSI,*(unsigned_short *)(in_RDI + 2));
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_set) {
			// source is NULL, nothing to do.
			return;
		}
		if (!target.is_set) {
			// target is NULL, use source value directly.
			OP::template Assign<typename STATE::TYPE>(target, source.value);
			target.is_set = true;
		} else {
			OP::template Execute<typename STATE::TYPE>(target, source.value);
		}
	}